

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

Ref<embree::SceneGraph::LightNode> __thiscall
embree::SceneGraph::LightNodeImpl<embree::SceneGraph::TriangleLight>::lerp
          (LightNodeImpl<embree::SceneGraph::TriangleLight> *this,
          Ref<embree::SceneGraph::LightNode> *light1_in,float f)

{
  _func_int **pp_Var1;
  long *in_RDX;
  TriangleLight *in_RSI;
  LightNode *in_RDI;
  Ref<embree::SceneGraph::LightNodeImpl<embree::SceneGraph::TriangleLight>_> light1;
  TriangleLight *in_stack_fffffffffffffed8;
  LightNodeImpl<embree::SceneGraph::TriangleLight> *this_00;
  long *local_100;
  LightNode *pLVar2;
  TriangleLight *light0;
  long *local_70 [5];
  _func_int **local_48;
  long **local_30;
  long **local_28;
  long **local_20;
  long *local_10;
  long **local_8;
  
  local_30 = local_70;
  light0 = (TriangleLight *)*in_RDX;
  pLVar2 = in_RDI;
  if (light0 == (TriangleLight *)0x0) {
    local_100 = (long *)0x0;
  }
  else {
    local_100 = (long *)__dynamic_cast(light0,&LightNode::typeinfo,&typeinfo,0);
  }
  local_8 = local_70;
  local_10 = local_100;
  local_70[0] = local_100;
  if (local_100 != (long *)0x0) {
    (**(code **)(*local_100 + 0x10))();
  }
  pp_Var1 = (_func_int **)operator_new(0x3d0d97);
  this_00 = (LightNodeImpl<embree::SceneGraph::TriangleLight> *)&in_RSI[1].v1;
  local_28 = local_70;
  TriangleLight::lerp(light0,in_RSI,(float)((ulong)pLVar2 >> 0x20));
  LightNodeImpl(this_00,in_stack_fffffffffffffed8);
  (in_RDI->super_Node).super_RefCount._vptr_RefCount = pp_Var1;
  local_48 = pp_Var1;
  if ((in_RDI->super_Node).super_RefCount._vptr_RefCount != (_func_int **)0x0) {
    (**(code **)(*(in_RDI->super_Node).super_RefCount._vptr_RefCount + 0x10))();
  }
  local_20 = local_70;
  if (local_70[0] != (long *)0x0) {
    (**(code **)(*local_70[0] + 0x18))();
  }
  return (Ref<embree::SceneGraph::LightNode>)pLVar2;
}

Assistant:

virtual Ref<LightNode> lerp(const Ref<LightNode>& light1_in, float f) const
      {
        const Ref<LightNodeImpl<Light>> light1 = light1_in.dynamicCast<LightNodeImpl<Light>>();
        assert(light1);
        return new LightNodeImpl(Light::lerp(light,light1->light,f));
      }